

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool __thiscall duckdb_re2::CharClassBuilder::AddRange(CharClassBuilder *this,Rune lo,Rune hi)

{
  RuneRangeSet *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  iterator iVar4;
  uint uVar5;
  key_type local_38;
  
  if (lo <= hi) {
    if (0x40 < hi && lo < 0x7b) {
      uVar3 = 0x41;
      if (0x41 < lo) {
        uVar3 = lo;
      }
      uVar5 = 0x5a;
      if ((uint)hi < 0x5a) {
        uVar5 = hi;
      }
      if (uVar3 <= uVar5) {
        this->upper_ = this->upper_ |
                       ~(-1 << (((char)uVar5 - (char)uVar3) + 1U & 0x1f)) <<
                       ((char)uVar3 + 0xbfU & 0x1f);
      }
      uVar3 = 0x61;
      if (0x61 < lo) {
        uVar3 = lo;
      }
      uVar5 = 0x7a;
      if ((uint)hi < 0x7a) {
        uVar5 = hi;
      }
      if (uVar3 <= uVar5) {
        this->lower_ = this->lower_ |
                       ~(-1 << (((char)uVar5 - (char)uVar3) + 1U & 0x1f)) <<
                       ((char)uVar3 + 0x9fU & 0x1f);
      }
    }
    this_00 = &this->ranges_;
    local_38.hi = lo;
    local_38.lo = lo;
    iVar4 = std::
            _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
            ::find(&this_00->_M_t,&local_38);
    p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
    if ((((_Rb_tree_header *)iVar4._M_node == p_Var1) || (lo < (int)iVar4._M_node[1]._M_color)) ||
       (*(int *)&iVar4._M_node[1].field_0x4 < hi)) {
      if (0 < lo) {
        local_38.hi = lo + -1;
        local_38.lo = lo + -1;
        iVar4 = std::
                _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                ::find(&this_00->_M_t,&local_38);
        if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
          lo = iVar4._M_node[1]._M_color;
          uVar3 = *(uint *)&iVar4._M_node[1].field_0x4;
          if (hi < (int)uVar3) {
            hi = uVar3;
          }
          this->nrunes_ = this->nrunes_ + ~uVar3 + lo;
          std::
          _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
          ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                              *)this_00,(const_iterator)iVar4._M_node);
        }
      }
      if (hi < 0x10ffff) {
        local_38.hi = hi + 1U;
        local_38.lo = hi + 1U;
        iVar4 = std::
                _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                ::find(&this_00->_M_t,&local_38);
        if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
          hi = *(Rune *)&iVar4._M_node[1].field_0x4;
          this->nrunes_ = this->nrunes_ + ~hi + iVar4._M_node[1]._M_color;
          std::
          _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
          ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                              *)this_00,(const_iterator)iVar4._M_node);
        }
      }
      while( true ) {
        local_38.hi = hi;
        local_38.lo = lo;
        iVar4 = std::
                _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                ::find(&this_00->_M_t,&local_38);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var1) break;
        this->nrunes_ =
             this->nrunes_ + ~*(uint *)&iVar4._M_node[1].field_0x4 + iVar4._M_node[1]._M_color;
        std::
        _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
        ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                            *)this_00,(const_iterator)iVar4._M_node);
      }
      this->nrunes_ = this->nrunes_ + (hi - lo) + 1;
      std::
      _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
      ::_M_insert_unique<duckdb_re2::RuneRange>(&this_00->_M_t,&local_38);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool CharClassBuilder::AddRange(Rune lo, Rune hi) {
  if (hi < lo)
    return false;

  if (lo <= 'z' && hi >= 'A') {
    // Overlaps some alpha, maybe not all.
    // Update bitmaps telling which ASCII letters are in the set.
    Rune lo1 = std::max<Rune>(lo, 'A');
    Rune hi1 = std::min<Rune>(hi, 'Z');
    if (lo1 <= hi1)
      upper_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'A');

    lo1 = std::max<Rune>(lo, 'a');
    hi1 = std::min<Rune>(hi, 'z');
    if (lo1 <= hi1)
      lower_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'a');
  }

  {  // Check whether lo, hi is already in the class.
    iterator it = ranges_.find(RuneRange(lo, lo));
    if (it != end() && it->lo <= lo && hi <= it->hi)
      return false;
  }

  // Look for a range abutting lo on the left.
  // If it exists, take it out and increase our range.
  if (lo > 0) {
    iterator it = ranges_.find(RuneRange(lo-1, lo-1));
    if (it != end()) {
      lo = it->lo;
      if (it->hi > hi)
        hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for a range abutting hi on the right.
  // If it exists, take it out and increase our range.
  if (hi < Runemax) {
    iterator it = ranges_.find(RuneRange(hi+1, hi+1));
    if (it != end()) {
      hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for ranges between lo and hi.  Take them out.
  // This is only safe because the set has no overlapping ranges.
  // We've already removed any ranges abutting lo and hi, so
  // any that overlap [lo, hi] must be contained within it.
  for (;;) {
    iterator it = ranges_.find(RuneRange(lo, hi));
    if (it == end())
      break;
    nrunes_ -= it->hi - it->lo + 1;
    ranges_.erase(it);
  }

  // Finally, add [lo, hi].
  nrunes_ += hi - lo + 1;
  ranges_.insert(RuneRange(lo, hi));
  return true;
}